

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cswCut.c
# Opt level: O1

uint * Csw_CutComputeTruth(Csw_Man_t *p,Csw_Cut_t *pCut,Csw_Cut_t *pCut0,Csw_Cut_t *pCut1,
                          int fCompl0,int fCompl1)

{
  char cVar1;
  int iVar2;
  int iVar3;
  uint *puVar4;
  uint *puVar5;
  bool bVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  
  uVar8 = 1 << ((char)p->nLeafMax - 5U & 0x1f);
  if (p->nLeafMax < 6) {
    uVar8 = 1;
  }
  uVar7 = (ulong)uVar8;
  puVar4 = p->puTemp[0];
  cVar1 = pCut0->nLeafMax;
  if (fCompl0 == 0) {
    if (0 < (int)uVar8) {
      do {
        puVar4[uVar7 - 1] = *(uint *)(&pCut0->nCutSize + (long)cVar1 * 2 + uVar7 * 2);
        bVar6 = 1 < (long)uVar7;
        uVar7 = uVar7 - 1;
      } while (bVar6);
    }
  }
  else if (0 < (int)uVar8) {
    do {
      puVar4[uVar7 - 1] = ~*(uint *)(&pCut0->nCutSize + (long)cVar1 * 2 + uVar7 * 2);
      bVar6 = 1 < (long)uVar7;
      uVar7 = uVar7 - 1;
    } while (bVar6);
  }
  if ((long)pCut->nFanins < 1) {
    uVar8 = 0;
  }
  else {
    lVar9 = 0;
    iVar10 = 0;
    uVar8 = 0;
    do {
      if (iVar10 == pCut0->nFanins) break;
      iVar2 = *(int *)((long)&pCut0[1].pNext + (long)iVar10 * 4);
      iVar3 = *(int *)((long)&pCut[1].pNext + lVar9 * 4);
      if (iVar2 <= iVar3) {
        if (iVar3 != iVar2) goto LAB_004a27ff;
        uVar8 = uVar8 | 1 << ((uint)lVar9 & 0x1f);
        iVar10 = iVar10 + 1;
      }
      lVar9 = lVar9 + 1;
    } while (pCut->nFanins != lVar9);
  }
  Kit_TruthStretch(p->puTemp[2],p->puTemp[0],(int)pCut0->nFanins,p->nLeafMax,uVar8,0);
  uVar8 = 1 << ((char)p->nLeafMax - 5U & 0x1f);
  if (p->nLeafMax < 6) {
    uVar8 = 1;
  }
  uVar7 = (ulong)uVar8;
  puVar4 = p->puTemp[1];
  cVar1 = pCut1->nLeafMax;
  if (fCompl1 == 0) {
    if (0 < (int)uVar8) {
      do {
        puVar4[uVar7 - 1] = *(uint *)(&pCut1->nCutSize + (long)cVar1 * 2 + uVar7 * 2);
        bVar6 = 1 < (long)uVar7;
        uVar7 = uVar7 - 1;
      } while (bVar6);
    }
  }
  else if (0 < (int)uVar8) {
    do {
      puVar4[uVar7 - 1] = ~*(uint *)(&pCut1->nCutSize + (long)cVar1 * 2 + uVar7 * 2);
      bVar6 = 1 < (long)uVar7;
      uVar7 = uVar7 - 1;
    } while (bVar6);
  }
  if ((long)pCut->nFanins < 1) {
    uVar8 = 0;
  }
  else {
    lVar9 = 0;
    iVar10 = 0;
    uVar8 = 0;
    do {
      if (iVar10 == pCut1->nFanins) break;
      iVar2 = *(int *)((long)&pCut1[1].pNext + (long)iVar10 * 4);
      iVar3 = *(int *)((long)&pCut[1].pNext + lVar9 * 4);
      if (iVar2 <= iVar3) {
        if (iVar3 != iVar2) {
LAB_004a27ff:
          __assert_fail("pCut->pFanins[i] == pCut1->pFanins[k]",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/csw/cswCut.c"
                        ,0x83,"unsigned int Cut_TruthPhase(Csw_Cut_t *, Csw_Cut_t *)");
        }
        uVar8 = uVar8 | 1 << ((uint)lVar9 & 0x1f);
        iVar10 = iVar10 + 1;
      }
      lVar9 = lVar9 + 1;
    } while (pCut->nFanins != lVar9);
  }
  Kit_TruthStretch(p->puTemp[3],p->puTemp[1],(int)pCut1->nFanins,p->nLeafMax,uVar8,0);
  cVar1 = pCut->nLeafMax;
  uVar8 = 1 << ((char)p->nLeafMax - 5U & 0x1f);
  if (p->nLeafMax < 6) {
    uVar8 = 1;
  }
  if (0 < (int)uVar8) {
    puVar4 = p->puTemp[2];
    puVar5 = p->puTemp[3];
    uVar7 = (ulong)uVar8;
    do {
      *(uint *)(&pCut->nCutSize + (long)cVar1 * 2 + uVar7 * 2) =
           puVar5[uVar7 - 1] & puVar4[uVar7 - 1];
      bVar6 = 1 < (long)uVar7;
      uVar7 = uVar7 - 1;
    } while (bVar6);
  }
  return (uint *)((long)&pCut[1].pNext + (long)cVar1 * 4);
}

Assistant:

unsigned * Csw_CutComputeTruth( Csw_Man_t * p, Csw_Cut_t * pCut, Csw_Cut_t * pCut0, Csw_Cut_t * pCut1, int fCompl0, int fCompl1 )
{
    // permute the first table
    if ( fCompl0 ) 
        Kit_TruthNot( p->puTemp[0], Csw_CutTruth(pCut0), p->nLeafMax );
    else
        Kit_TruthCopy( p->puTemp[0], Csw_CutTruth(pCut0), p->nLeafMax );
    Kit_TruthStretch( p->puTemp[2], p->puTemp[0], pCut0->nFanins, p->nLeafMax, Cut_TruthPhase(pCut, pCut0), 0 );
    // permute the second table
    if ( fCompl1 ) 
        Kit_TruthNot( p->puTemp[1], Csw_CutTruth(pCut1), p->nLeafMax );
    else
        Kit_TruthCopy( p->puTemp[1], Csw_CutTruth(pCut1), p->nLeafMax );
    Kit_TruthStretch( p->puTemp[3], p->puTemp[1], pCut1->nFanins, p->nLeafMax, Cut_TruthPhase(pCut, pCut1), 0 );
    // produce the resulting table
    Kit_TruthAnd( Csw_CutTruth(pCut), p->puTemp[2], p->puTemp[3], p->nLeafMax );
//    assert( pCut->nFanins >= Kit_TruthSupportSize( Csw_CutTruth(pCut), p->nLeafMax ) );
    return Csw_CutTruth(pCut);
}